

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  uint uVar7;
  char *pcVar8;
  string *arg;
  pointer pbVar9;
  char *local_4d8 [4];
  string outname;
  ostringstream outputStream;
  long alStack_488 [45];
  ostringstream cmCTestLog_msg;
  ostringstream indexStr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStream);
  uVar7 = this->RepeatMode + ~AfterTimeout;
  if ((0xfffffffd < uVar7 || this->NumberOfRunsLeft != 1) &&
     ((uVar7 < 0xfffffffe || (this->NumberOfRunsLeft != this->NumberOfRunsTotal)))) {
    bVar3 = cmCTest::GetTestProgressOutput(this->CTest);
    if (!bVar3) {
      iVar4 = getNumWidth(total);
      poVar6 = &outputStream;
      *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar4;
      pcVar8 = "  ";
      std::operator<<((ostream *)poVar6,"  ");
      iVar4 = getNumWidth(total);
      *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar4;
      goto LAB_001b4230;
    }
  }
  iVar4 = getNumWidth(total);
  *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar4;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&outputStream);
  std::operator<<(poVar5,"/");
  iVar4 = getNumWidth(total);
  *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar4;
  poVar6 = (ostringstream *)std::ostream::_M_insert<unsigned_long>((ulong)&outputStream);
  pcVar8 = " ";
LAB_001b4230:
  std::operator<<((ostream *)poVar6,pcVar8);
  pcVar8 = "Test";
  if (this->TestHandler->MemCheck != false) {
    pcVar8 = "MemCheck";
  }
  std::operator<<((ostream *)&outputStream,pcVar8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
  poVar5 = std::operator<<((ostream *)&indexStr," #");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->Index);
  std::operator<<(poVar5,":");
  iVar4 = getNumWidth((long)this->TestHandler->MaxIndex);
  *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)(iVar4 + 3);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&outputStream,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::operator<<((ostream *)&outputStream," ");
  iVar4 = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+(&outname,&this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&outname,(char)iVar4 + '\x04');
  std::operator<<((ostream *)&outputStream,(string *)&outname);
  poVar5 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar5 = std::operator<<(poVar5,"/");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," Testing: ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar5 = std::operator<<(poVar5,"/");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," Test: ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar5 = std::operator<<(poVar5,(string *)&this->ActualCommand);
  std::operator<<(poVar5,"\"");
  pbVar1 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; poVar5 = this->TestHandler->LogFile,
      pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    poVar5 = std::operator<<(poVar5," \"");
    poVar5 = std::operator<<(poVar5,(string *)pbVar9);
    std::operator<<(poVar5,"\"");
  }
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"Directory: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->TestProperties->Directory);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  poVar5 = std::operator<<(poVar5,"\" start time: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->StartTime);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"----------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar5 = std::operator<<(poVar5,"<end of output>");
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar3 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)local_4d8);
    std::__cxx11::string::~string((string *)local_4d8);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3b5,local_4d8[0],false);
    std::__cxx11::string::~string((string *)local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Testing ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::operator<<(poVar5," ... ");
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x3b9,local_4d8[0],false);
  std::__cxx11::string::~string((string *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStream);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  std::ostringstream outputStream;

  // If this is the last or only run of this test, or progress output is
  // requested, then print out completed / total.
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  bool const progressOnLast =
    (this->RepeatMode != cmCTest::Repeat::UntilPass &&
     this->RepeatMode != cmCTest::Repeat::AfterTimeout);
  if ((progressOnLast && this->NumberOfRunsLeft == 1) ||
      (!progressOnLast && this->NumberOfRunsLeft == this->NumberOfRunsTotal) ||
      this->CTest->GetTestProgressOutput()) {
    outputStream << std::setw(getNumWidth(total)) << completed << "/";
    outputStream << std::setw(getNumWidth(total)) << total << " ";
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    outputStream << std::setw(getNumWidth(total)) << "  ";
    outputStream << std::setw(getNumWidth(total)) << "  ";
  }

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');
  outputStream << outname;

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::string const& arg : this->Arguments) {
    *this->TestHandler->LogFile << " \"" << arg << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  cmCTestLog(this->CTest, DEBUG,
             "Testing " << this->TestProperties->Name << " ... ");
}